

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

void __thiscall despot::ParticleBelief::~ParticleBelief(ParticleBelief *this)

{
  DSPOMDP *pDVar1;
  size_type sVar2;
  reference ppSVar3;
  int local_18;
  int local_14;
  int i_1;
  int i;
  ParticleBelief *this_local;
  
  (this->super_Belief)._vptr_Belief = (_func_int **)&PTR__ParticleBelief_0026e090;
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    if (sVar2 <= (ulong)(long)local_14) break;
    pDVar1 = (this->super_Belief).model_;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)local_14);
    (*pDVar1->_vptr_DSPOMDP[0x17])(pDVar1,*ppSVar3);
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      (&this->initial_particles_);
    if (sVar2 <= (ulong)(long)local_18) break;
    pDVar1 = (this->super_Belief).model_;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->initial_particles_,(long)local_18);
    (*pDVar1->_vptr_DSPOMDP[0x17])(pDVar1,*ppSVar3);
    local_18 = local_18 + 1;
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&this->initial_particles_)
  ;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&this->particles_);
  Belief::~Belief(&this->super_Belief);
  return;
}

Assistant:

ParticleBelief::~ParticleBelief() {
	for (int i = 0; i < particles_.size(); i++) {
		model_->Free(particles_[i]);
	}

	for (int i = 0; i < initial_particles_.size(); i++) {
		model_->Free(initial_particles_[i]);
	}
}